

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall cmCTestTestHandler::SetTestsToRunInformation(cmCTestTestHandler *this,char *in)

{
  bool bVar1;
  unsigned_long uVar2;
  void *pvVar3;
  allocator local_241;
  string local_240;
  ifstream fin;
  long local_218;
  
  if (in != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->TestsToRunString);
    bVar1 = cmsys::SystemTools::FileExists(in);
    if (bVar1) {
      std::ifstream::ifstream(&fin,in,_S_in);
      std::__cxx11::string::string((string *)&local_240,in,&local_241);
      uVar2 = cmsys::SystemTools::FileLength(&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      pvVar3 = operator_new__(uVar2 + 1);
      std::istream::getline((char *)&fin,(long)pvVar3);
      *(undefined1 *)((long)pvVar3 + local_218) = 0;
      std::__cxx11::string::assign((char *)&this->TestsToRunString);
      operator_delete__(pvVar3);
      std::ifstream::~ifstream(&fin);
    }
  }
  return;
}

Assistant:

void cmCTestTestHandler::SetTestsToRunInformation(const char* in)
{
  if ( !in )
    {
    return;
    }
  this->TestsToRunString = in;
  // if the argument is a file, then read it and use the contents as the
  // string
  if(cmSystemTools::FileExists(in))
    {
    cmsys::ifstream fin(in);
    unsigned long filelen = cmSystemTools::FileLength(in);
    char* buff = new char[filelen+1];
    fin.getline(buff, filelen);
    buff[fin.gcount()] = 0;
    this->TestsToRunString = buff;
    delete [] buff;
    }
}